

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::noteInterfacePortDriver
          (Compilation *this,HierarchicalReference *ref,ValueDriver *driver)

{
  pointer *ppIVar1;
  InterfacePortSymbol *this_00;
  iterator __position;
  bool bVar2;
  InstanceSideEffects *this_01;
  HierarchicalReference *ref_00;
  pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
  local_40;
  
  this_00 = (InterfacePortSymbol *)(((ref->path)._M_ptr)->symbol).ptr;
  this_01 = getOrAddSideEffects(this,((this_00->super_Symbol).parentScope)->thisSym);
  __position._M_current =
       (this_01->ifacePortDrivers).
       super__Vector_base<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver,_std::allocator<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_40.first.first = (Symbol *)ref;
  local_40.first.second = (ModportSymbol *)driver;
  if (__position._M_current ==
      (this_01->ifacePortDrivers).
      super__Vector_base<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver,_std::allocator<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver,_std::allocator<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver>_>
    ::_M_realloc_insert<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver>
              (&this_01->ifacePortDrivers,__position,(IfacePortDriver *)&local_40);
  }
  else {
    ((__position._M_current)->ref).ptr = ref;
    ((__position._M_current)->driver).ptr = driver;
    ppIVar1 = &(this_01->ifacePortDrivers).
               super__Vector_base<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver,_std::allocator<slang::ast::Compilation::InstanceSideEffects::IfacePortDriver>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  InterfacePortSymbol::getConnectionAndExpr(&local_40,this_00);
  if ((local_40.second != (Expression *)0x0) && ((local_40.second)->kind == ArbitrarySymbol)) {
    bVar2 = HierarchicalReference::isViaIfacePort((HierarchicalReference *)&local_40.second[1].type)
    ;
    if (bVar2) {
      ref_00 = HierarchicalReference::join
                         ((HierarchicalReference *)&local_40.second[1].type,this,ref);
      noteInterfacePortDriver(this,ref_00,driver);
    }
  }
  return;
}

Assistant:

void Compilation::noteInterfacePortDriver(const HierarchicalReference& ref,
                                          const ValueDriver& driver) {
    SLANG_ASSERT(!isFrozen());
    SLANG_ASSERT(ref.isViaIfacePort());
    SLANG_ASSERT(ref.target);
    SLANG_ASSERT(ref.expr);

    auto& port = ref.path[0].symbol->as<InterfacePortSymbol>();
    auto scope = port.getParentScope();
    SLANG_ASSERT(scope);

    auto& symbol = scope->asSymbol();
    SLANG_ASSERT(symbol.kind == SymbolKind::InstanceBody);

    auto& entry = getOrAddSideEffects(symbol);
    entry.ifacePortDrivers.push_back({&ref, &driver});

    auto [_, expr] = port.getConnectionAndExpr();
    if (expr && expr->kind == ExpressionKind::ArbitrarySymbol) {
        auto& connRef = expr->as<ArbitrarySymbolExpression>().hierRef;
        if (connRef.isViaIfacePort())
            noteInterfacePortDriver(connRef.join(*this, ref), driver);
    }
}